

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
exr_write_deep_scanline_chunk
          (exr_context_t ctxt,int part_index,int y,void *packed_data,uint64_t packed_size,
          uint64_t unpacked_size,void *sample_data,uint64_t sample_data_size)

{
  _internal_exr_part *part;
  exr_result_t eVar1;
  _internal_exr_context *pctxt;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
    if (part->storage_mode != EXR_STORAGE_SCANLINE) {
      eVar1 = write_scan_chunk((_internal_exr_context *)ctxt,part_index,part,y,packed_data,
                               packed_size,unpacked_size,sample_data,sample_data_size);
      return eVar1;
    }
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,0x1c);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_write_deep_scanline_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           y,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_SCANLINE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_USE_SCAN_NONDEEP_WRITE));

    rv = write_scan_chunk (
        pctxt,
        part_index,
        part,
        y,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}